

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O1

void __thiscall Connection_testTeach_Test::TestBody(Connection_testTeach_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  Connection s;
  AssertHelper local_60;
  Connection local_58;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  float local_2c;
  Connection local_28;
  
  Connection::Connection(&local_28,(Neuron *)0x0,10.0,100.0,100.0);
  Connection::teach(&local_28,1.0);
  Connection::Connection(&local_58,(Neuron *)0x0,11.0,100.0,100.0);
  local_60.data_._0_4_ = Connection::weight(&local_58);
  local_2c = Connection::weight(&local_28);
  testing::internal::CmpHelperEQ<float,float>
            (local_40,"Connection(0, 11).weight()","s.weight()",(float *)&local_60,&local_2c);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x21,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_58.m_target + 8))();
      }
      local_58.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Connection::teach(&local_28,10.0);
  Connection::Connection(&local_58,(Neuron *)0x0,21.0,100.0,100.0);
  local_60.data_._0_4_ = Connection::weight(&local_58);
  local_2c = Connection::weight(&local_28);
  testing::internal::CmpHelperEQ<float,float>
            (local_40,"Connection(0, 21).weight()","s.weight()",(float *)&local_60,&local_2c);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/valbok[P]snu/src/brain/tests/NeuronTest.cpp"
               ,0x23,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (local_58.m_target != (Neuron *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_58.m_target != (Neuron *)0x0)) {
        (**(code **)(*(long *)local_58.m_target + 8))();
      }
      local_58.m_target = (Neuron *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(Connection, testTeach)
{
    Connection s(0, 10);
    s.teach(1);
    EXPECT_EQ(Connection(0, 11).weight(), s.weight());
    s.teach(10);
    EXPECT_EQ(Connection(0, 21).weight(), s.weight());
}